

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

string * __thiscall
cmFindProgramCommand::FindProgram
          (string *__return_storage_ptr__,cmFindProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  string local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_70);
  if (((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleFirst != false) ||
     ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly == true)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_38,names);
    FindAppBundle(&local_70,this,&local_38);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    if ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleOnly == false) {
      cmsys::SystemTools::FindProgram
                (&local_70,names,&(this->super_cmFindBase).super_cmFindCommon.SearchPaths,true);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (__return_storage_ptr__->_M_string_length != 0) {
        return __return_storage_ptr__;
      }
    }
    if ((this->super_cmFindBase).super_cmFindCommon.SearchAppBundleLast == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_50,names);
      FindAppBundle(&local_70,this,&local_50);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindProgram(std::vector<std::string> names)
{
  std::string program = "";

  if(this->SearchAppBundleFirst || this->SearchAppBundleOnly)
    {
    program = FindAppBundle(names);
    }
  if(program.empty() && !this->SearchAppBundleOnly)
    {
    program = cmSystemTools::FindProgram(names, this->SearchPaths, true);
    }

  if(program.empty() && this->SearchAppBundleLast)
    {
    program = this->FindAppBundle(names);
    }
  return program;
}